

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O1

void __thiscall pg::PPSolver::setDominion(PPSolver *this,int p)

{
  int node;
  int *piVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  int strategy;
  ulong uVar5;
  int *piVar6;
  
  if ((this->super_Solver).trace != 0) {
    poVar4 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\x1b[1;38;5;201mdominion \x1b[36m",0x1b);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[m",3);
  }
  piVar6 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar6 != piVar1) {
    bVar3 = (bool)((byte)p & 1);
    do {
      node = *piVar6;
      uVar5 = (ulong)node;
      if (this->region[uVar5] != p) {
        __assert_fail("region[i] == p",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                      ,0xda,"void pg::PPSolver::setDominion(int)");
      }
      if (((((((this->super_Solver).game)->_owner)._bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) !=
           bVar3) &&
         (((long)this->strategy[uVar5] == -1 || (this->region[this->strategy[uVar5]] != p)))) {
        __assert_fail("owner(i) != pl or (strategy[i] != -1 and region[strategy[i]] == p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/pp.cpp"
                      ,0xdb,"void pg::PPSolver::setDominion(int)");
      }
      if (1 < (this->super_Solver).trace) {
        poVar4 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        std::ostream::operator<<(poVar4,node);
      }
      strategy = -1;
      if ((((((this->super_Solver).game)->_owner)._bits[uVar5 >> 6] & 1L << (uVar5 & 0x3f)) == 0) !=
          bVar3) {
        strategy = this->strategy[uVar5];
      }
      Oink::solve((this->super_Solver).oink,node,p & 1,strategy);
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar1);
  }
  if ((this->super_Solver).trace != 0) {
    poVar4 = (this->super_Solver).logger;
    cVar2 = (char)poVar4;
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  Oink::flush((this->super_Solver).oink);
  return;
}

Assistant:

void
PPSolver::setDominion(int p)
{
    // found a dominion
    const int pl = p&1;
    if (trace) logger << "\033[1;38;5;201mdominion \033[36m" << p << "\033[m";
    for (int i : regions[p]) {
        assert(region[i] == p);
        assert(owner(i) != pl or (strategy[i] != -1 and region[strategy[i]] == p));
#ifndef NDEBUG
        if (trace >= 2) logger << " " << i;
#endif
        Solver::solve(i, pl, owner(i) == pl ? strategy[i] : -1);
    }
    if (trace) logger << std::endl;
    Solver::flush();
}